

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-queue.c
# Opt level: O2

void up_heap(priority_queue *qp,size_t i)

{
  priority_queue_element *ppVar1;
  anon_union_8_2_94730108_for_payload aVar2;
  wchar_t wVar3;
  undefined4 uVar4;
  wchar_t wVar5;
  undefined4 uVar6;
  ulong uVar7;
  priority_queue_element *ppVar8;
  priority_queue_element tmp;
  
  while( true ) {
    if (i == 0) {
      return;
    }
    uVar7 = i - 1 >> 1;
    ppVar1 = qp->data;
    if (ppVar1[uVar7].priority <= ppVar1[i].priority) break;
    ppVar8 = ppVar1 + uVar7;
    aVar2 = ppVar8->payload;
    wVar5 = ppVar8->priority;
    uVar6 = *(undefined4 *)&ppVar8->field_0xc;
    ppVar1 = ppVar1 + i;
    wVar3 = ppVar1->priority;
    uVar4 = *(undefined4 *)&ppVar1->field_0xc;
    ppVar8->payload = ppVar1->payload;
    ppVar8->priority = wVar3;
    *(undefined4 *)&ppVar8->field_0xc = uVar4;
    ppVar1 = qp->data + i;
    ppVar1->payload = aVar2;
    ppVar1->priority = wVar5;
    *(undefined4 *)&ppVar1->field_0xc = uVar6;
    i = uVar7;
  }
  return;
}

Assistant:

static void up_heap(struct priority_queue *qp, size_t i)
{
	while (1) {
		size_t parent;
		struct priority_queue_element tmp;

		if (i == 0) {
			break;
		}
		parent = (i - 1) >> 1;
		if (qp->data[i].priority >= qp->data[parent].priority) {
			break;
		}
		tmp = qp->data[parent];
		qp->data[parent] = qp->data[i];
		qp->data[i] = tmp;
		i = parent;
	}
}